

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>::eraseLast
          (QGenericArrayOps<QTextBrowserPrivate::HistoryEntry> *this)

{
  qsizetype *pqVar1;
  
  QTextBrowserPrivate::HistoryEntry::~HistoryEntry
            ((this->super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>).ptr +
             (this->super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>).size + -1);
  pqVar1 = &(this->super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>).size;
  *pqVar1 = *pqVar1 + -1;
  return;
}

Assistant:

void eraseLast() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        (this->end() - 1)->~T();
        --this->size;
    }